

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O2

uint32 __thiscall Clasp::ReduceParams::prepare(ReduceParams *this,bool withLookback)

{
  undefined3 in_register_00000031;
  float fVar1;
  float fVar2;
  
  if ((CONCAT31(in_register_00000031,withLookback) == 0) ||
     ((fVar1 = (float)((uint)this->strategy >> 0xb & 0x7f) / 100.0, fVar1 == 0.0 && (!NAN(fVar1)))))
  {
    disable(this);
    return 0;
  }
  if ((*(int *)&this->cflSched == 0x40000000) &&
     (*(uint *)&this->growSched != 0x40000000 && (*(uint *)&this->growSched & 0x3fffffff) == 0)) {
    *(undefined8 *)&this->cflSched = 0x40000fa0;
    (this->cflSched).len = 0;
    (this->cflSched).grow = 600.0;
  }
  fVar1 = this->fMax;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    return 0;
  }
  fVar2 = this->fInit;
  if (this->fInit <= fVar1) {
    fVar2 = fVar1;
  }
  this->fMax = fVar2;
  return 0;
}

Assistant:

uint32 ReduceParams::prepare(bool withLookback) {
	if (!withLookback || fReduce() == 0.0f) {
		disable();
		return 0;
	}
	if (cflSched.defaulted() && growSched.disabled() && !growSched.defaulted()) {
		cflSched = ScheduleStrategy::arith(4000, 600);
	}
	if (fMax != 0.0f) { fMax = std::max(fMax, fInit); }
	return 0;
}